

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O0

size_t Kernel::FlatTerm::getEntryCount(Term *t)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  TermList this;
  size_t sVar4;
  Term *in_RDI;
  uint numVarOccs;
  TermList sort;
  undefined4 in_stack_ffffffffffffffe0;
  Term *in_stack_ffffffffffffffe8;
  Literal *in_stack_fffffffffffffff8;
  
  bVar1 = Term::isLiteral((Term *)0x853b63);
  if ((bVar1) && (bVar1 = Literal::isEquality((Literal *)0x853b76), bVar1)) {
    this = SortHelper::getEqualityArgumentSort(in_stack_fffffffffffffff8);
    uVar2 = Term::numVarOccs((Term *)this._content);
    bVar1 = Term::isTwoVarEquality(in_RDI);
    if (!bVar1) {
      bVar1 = TermList::isVar((TermList *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      if (bVar1) {
        uVar3 = 1;
      }
      else {
        TermList::term((TermList *)0x853bcf);
        uVar3 = Term::numVarOccs((Term *)this._content);
      }
      uVar2 = uVar3 + uVar2;
    }
    uVar3 = Term::weight(in_RDI);
    sVar4 = (ulong)(uVar3 + 1) * 3 + (ulong)uVar2 * -2;
  }
  else {
    uVar2 = Term::weight(in_RDI);
    uVar3 = Term::numVarOccs(in_stack_ffffffffffffffe8);
    sVar4 = (ulong)uVar2 * 3 + (ulong)uVar3 * -2;
  }
  return sVar4;
}

Assistant:

size_t FlatTerm::getEntryCount(Term* t)
{
  //FUNCTION_ENTRY_COUNT entries per function and one per variable
  if (t->isLiteral() && static_cast<Literal*>(t)->isEquality()) {
    // we add the type to the flat term for equalities as an extra,
    // which requires some additional calculation
    auto sort = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(t));
    unsigned numVarOccs = t->numVarOccs();
    if (!t->isTwoVarEquality()) {
      // in case of non-two-var equalities, the variables in
      // the type are not counted by Term::numVarOccs
      numVarOccs += sort.isVar() ? 1 : sort.term()->numVarOccs();
    }
    // the weight is corrected to be conservative in the
    // monomorphic case, we uncorrect it by adding 1
    return (t->weight()+1)*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*numVarOccs;
  }
  return t->weight()*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*t->numVarOccs();
}